

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::JsonUnitTestResultPrinter::PrintJsonTestList
               (ostream *stream,
               vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *test_suites)

{
  pointer ppTVar1;
  ostream *poVar2;
  ulong uVar3;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *__range2;
  int value;
  string local_b0;
  undefined1 local_90 [8];
  string kTestsuites;
  undefined1 local_50 [8];
  string kIndent;
  
  local_90 = (undefined1  [8])&kTestsuites._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"testsuites","");
  local_50 = (undefined1  [8])&kIndent._M_string_length;
  std::__cxx11::string::_M_construct((ulong)local_50,'\x02');
  std::__ostream_insert<char,std::char_traits<char>>(stream,"{\n",2);
  value = 0;
  for (ppTVar1 = (test_suites->
                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar1 !=
      (test_suites->super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>)
      ._M_impl.super__Vector_impl_data._M_finish; ppTVar1 = ppTVar1 + 1) {
    value = value + (int)((ulong)((long)((*ppTVar1)->test_info_list_).
                                        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)((*ppTVar1)->test_info_list_).
                                       super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  kTestsuites.field_2._8_8_ = &stack0xffffffffffffffa0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&kTestsuites.field_2 + 8),"tests","");
  OutputJsonKey(stream,(string *)local_90,(string *)((long)&kTestsuites.field_2 + 8),value,
                (string *)local_50,true);
  if ((undefined1 *)kTestsuites.field_2._8_8_ != &stack0xffffffffffffffa0) {
    operator_delete((void *)kTestsuites.field_2._8_8_);
  }
  kTestsuites.field_2._8_8_ = &stack0xffffffffffffffa0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&kTestsuites.field_2 + 8),"name","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"AllTests","");
  OutputJsonKey(stream,(string *)local_90,(string *)((long)&kTestsuites.field_2 + 8),&local_b0,
                (string *)local_50,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((undefined1 *)kTestsuites.field_2._8_8_ != &stack0xffffffffffffffa0) {
    operator_delete((void *)kTestsuites.field_2._8_8_);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)local_50,(long)kIndent._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(char *)local_90,(long)kTestsuites._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\": [\n",5);
  if ((test_suites->super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>)
      ._M_impl.super__Vector_impl_data._M_finish !=
      (test_suites->super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>)
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar3 = 0;
    do {
      if (uVar3 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
      }
      PrintJsonTestSuite(stream,(test_suites->
                                super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)(test_suites->
                                   super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(test_suites->
                                   super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)local_50,(long)kIndent._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}\n",2);
  if (local_50 != (undefined1  [8])&kIndent._M_string_length) {
    operator_delete((void *)local_50);
  }
  if (local_90 != (undefined1  [8])&kTestsuites._M_string_length) {
    operator_delete((void *)local_90);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonTestList(
    std::ostream* stream, const std::vector<TestSuite*>& test_suites) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";
  int total_tests = 0;
  for (auto test_suite : test_suites) {
    total_tests += test_suite->total_test_count();
  }
  OutputJsonKey(stream, kTestsuites, "tests", total_tests, kIndent);

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  for (size_t i = 0; i < test_suites.size(); ++i) {
    if (i != 0) {
      *stream << ",\n";
    }
    PrintJsonTestSuite(stream, *test_suites[i]);
  }

  *stream << "\n"
          << kIndent << "]\n"
          << "}\n";
}